

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Mix::doExpand
          (Mix *this,ExpandContext *param_1,ArgExprs *args_)

{
  ExprP<float> *arg1;
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> SStack_a8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_98;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_88;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_78;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_48;
  float local_34;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_30;
  
  arg1 = in_RCX + 2;
  local_34 = 1.0;
  constant<float>((BuiltinPrecisionTests *)&local_30,&local_34);
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)&local_68,(ExprP<float> *)&local_30,arg1);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_58,in_RCX,(ExprP<float> *)&local_68);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_78,in_RCX + 1,arg1);
  BuiltinPrecisionTests::operator+
            ((BuiltinPrecisionTests *)&local_48,(ExprP<float> *)&local_58,(ExprP<float> *)&local_78)
  ;
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&SStack_a8,in_RCX + 1,in_RCX);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_98,(ExprP<float> *)&SStack_a8,arg1);
  BuiltinPrecisionTests::operator+
            ((BuiltinPrecisionTests *)&local_88,in_RCX,(ExprP<float> *)&local_98);
  alternatives<float>((BuiltinPrecisionTests *)this,(ExprP<float> *)&local_48,
                      (ExprP<float> *)&local_88);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_88);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_98);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&SStack_a8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_78);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_30);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

static double step (double edge, double x)
{
	return x < edge ? 0.0 : 1.0;
}